

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::MessageReference::~MessageReference(MessageReference *this)

{
  MessageReference *this_local;
  
  omittable_field<bool>::~omittable_field(&this->fail_if_not_exists);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->guild_id);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->channel_id);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->message_id);
  return;
}

Assistant:

MessageReference(
        omittable_field<Snowflake> message_id = omitted,
        omittable_field<Snowflake> channel_id = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<bool> fail_if_not_exists = omitted
    ):
        message_id(message_id),
        channel_id(channel_id),
        guild_id(guild_id),
        fail_if_not_exists(fail_if_not_exists)
    {}